

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_7zip.c
# Opt level: O3

void test_read_format_7zip_zstd_solid(void)

{
  int iVar1;
  archive *_a;
  char *fmt;
  
  _a = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_7zip.c"
                   ,L'ζ',(uint)(_a != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_zstd(_a);
  if (iVar1 == 0) {
    iVar1 = archive_read_support_filter_xz(_a);
    if (iVar1 == 0) {
      test_extract_all_files_zstd("test_read_format_7zip_solid_zstd.7z");
      goto LAB_0015d1fb;
    }
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_7zip.c"
                   ,L'ξ');
    fmt = "7zip:lzma decoding is not supported on this platform";
  }
  else {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_7zip.c"
                   ,L'κ');
    fmt = "7zip:zstd decoding is not supported on this platform";
  }
  test_skipping(fmt);
LAB_0015d1fb:
  iVar1 = archive_read_free(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'τ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_7zip_zstd_solid)
{
	struct archive *a;

	assert((a = archive_read_new()) != NULL);

	/* Extracting with libzstd */
	if (ARCHIVE_OK != archive_read_support_filter_zstd(a)) {
		skipping(
		    "7zip:zstd decoding is not supported on this platform");
	} else if (ARCHIVE_OK != archive_read_support_filter_xz(a)) {
		// The directory header entries in the test file uses lzma.
		skipping(
		    "7zip:lzma decoding is not supported on this platform");
	} else {
		test_extract_all_files_zstd("test_read_format_7zip_solid_zstd.7z");
	}

	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}